

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoleFilter.cpp
# Opt level: O0

void __thiscall
Iir::BandPassTransform::BandPassTransform
          (BandPassTransform *this,double fc,double fw,LayoutBase *digital,LayoutBase *analog)

{
  uint uVar1;
  PoleZeroPair *pPVar2;
  LayoutBase *in_RDX;
  LayoutBase *in_RSI;
  double *in_RDI;
  double in_XMM0_Qa;
  double dVar3;
  double dVar4;
  double in_XMM1_Qa;
  BandPassTransform *unaff_retaddr;
  complex_t in_stack_00000008;
  double wn;
  ComplexPair zeros;
  ComplexPair poles;
  ComplexPair z1;
  ComplexPair p1;
  PoleZeroPair *pair;
  int i;
  int pairs;
  int numPoles;
  double ww;
  undefined8 in_stack_fffffffffffffec8;
  int pairIndex;
  LayoutBase *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffee0;
  ComplexPair *in_stack_ffffffffffffff10;
  ComplexPair *in_stack_ffffffffffffff18;
  LayoutBase *in_stack_ffffffffffffff20;
  complex_t *zero;
  complex_t *in_stack_ffffffffffffff68;
  LayoutBase *in_stack_ffffffffffffff70;
  int local_3c;
  
  *in_RDI = 0.0;
  in_RDI[1] = 0.0;
  in_RDI[2] = 0.0;
  in_RDI[3] = 0.0;
  in_RDI[4] = 0.0;
  in_RDI[5] = 0.0;
  in_RDI[6] = 0.0;
  in_RDI[7] = 0.0;
  if (0.5 <= in_XMM0_Qa) {
    throw_invalid_argument(in_stack_fffffffffffffee0);
  }
  if (in_XMM0_Qa < 0.0) {
    throw_invalid_argument(in_stack_fffffffffffffee0);
  }
  LayoutBase::reset(in_RSI);
  in_RDI[1] = in_XMM0_Qa * 6.283185307179586 + -((in_XMM1_Qa * 6.283185307179586) / 2.0);
  *in_RDI = in_RDI[1] + in_XMM1_Qa * 6.283185307179586;
  if (in_RDI[1] <= 1e-08 && in_RDI[1] != 1e-08) {
    in_RDI[1] = 1e-08;
  }
  if (3.141592643589793 < *in_RDI) {
    *in_RDI = 3.141592643589793;
  }
  dVar3 = cos((*in_RDI + in_RDI[1]) * 0.5);
  dVar4 = cos((*in_RDI - in_RDI[1]) * 0.5);
  in_RDI[2] = dVar3 / dVar4;
  dVar3 = tan((*in_RDI - in_RDI[1]) * 0.5);
  in_RDI[3] = 1.0 / dVar3;
  in_RDI[4] = in_RDI[2] * in_RDI[2];
  in_RDI[5] = in_RDI[3] * in_RDI[3];
  in_RDI[6] = in_RDI[2] * in_RDI[3];
  in_RDI[7] = in_RDI[6] * 2.0;
  uVar1 = LayoutBase::getNumPoles(in_RDX);
  for (local_3c = 0; pairIndex = (int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
      local_3c < (int)uVar1 / 2; local_3c = local_3c + 1) {
    pPVar2 = LayoutBase::operator[](in_stack_fffffffffffffed0,pairIndex);
    transform(unaff_retaddr,in_stack_00000008);
    zero = *(complex_t **)((pPVar2->zeros).super_complex_pair_t.first._M_value + 8);
    transform(unaff_retaddr,in_stack_00000008);
    LayoutBase::addPoleZeroConjugatePairs(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,zero);
    LayoutBase::addPoleZeroConjugatePairs(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,zero);
  }
  if ((uVar1 & 1) != 0) {
    LayoutBase::operator[](in_stack_fffffffffffffed0,pairIndex);
    transform(unaff_retaddr,in_stack_00000008);
    LayoutBase::operator[](in_stack_fffffffffffffed0,pairIndex);
    transform(unaff_retaddr,in_stack_00000008);
    LayoutBase::add(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  }
  dVar3 = LayoutBase::getNormalW(in_RDX);
  dVar4 = tan((*in_RDI + dVar3) * 0.5);
  dVar3 = tan((in_RDI[1] + dVar3) * 0.5);
  dVar3 = sqrt(dVar4 * dVar3);
  dVar3 = atan(dVar3);
  dVar4 = LayoutBase::getNormalGain(in_RDX);
  LayoutBase::setNormal(in_RSI,dVar3 * 2.0,dVar4);
  return;
}

Assistant:

BandPassTransform::BandPassTransform (double fc,
                                      double fw,
                                      LayoutBase& digital,
                                      LayoutBase const& analog)
{
	if (!(fc < 0.5)) throw_invalid_argument(cutoffError);
	if (fc < 0.0) throw_invalid_argument(cutoffNeg);

	digital.reset ();
	
	const double ww = 2 * doublePi * fw;
	
	// pre-calcs
	wc2 = 2 * doublePi * fc - (ww / 2);
	wc  = wc2 + ww;
	
	// what is this crap?
	if (wc2 < 1e-8)
		wc2 = 1e-8;
	if (wc  > doublePi-1e-8)
		wc  = doublePi-1e-8;
	
	a =     cos ((wc + wc2) * 0.5) /
		cos ((wc - wc2) * 0.5);
	b = 1 / tan ((wc - wc2) * 0.5);
	a2 = a * a;
	b2 = b * b;
	ab = a * b;
	ab_2 = 2 * ab;
	
	const int numPoles = analog.getNumPoles ();
	const int pairs = numPoles / 2;
	for (int i = 0; i < pairs; ++i)
	{
		const PoleZeroPair& pair = analog[i];
		ComplexPair p1 = transform (pair.poles.first);
		ComplexPair z1 = transform (pair.zeros.first);
		
		digital.addPoleZeroConjugatePairs (p1.first, z1.first);
		digital.addPoleZeroConjugatePairs (p1.second, z1.second);
	}
	
	if (numPoles & 1)
	{
		ComplexPair poles = transform (analog[pairs].poles.first);
		ComplexPair zeros = transform (analog[pairs].zeros.first);
		
		digital.add (poles, zeros);
	}
	
	double wn = analog.getNormalW();
	digital.setNormal (2 * atan (sqrt (tan ((wc + wn)* 0.5) * tan((wc2 + wn)* 0.5))),
			   analog.getNormalGain());
}